

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libSupport.c
# Opt level: O1

void call_inits(Abc_Frame_t *pAbc)

{
  long lVar1;
  code *pcVar2;
  ulong uVar3;
  
  if (libHandles[0] != (void *)0x0) {
    uVar3 = 0;
    do {
      pcVar2 = (code *)dlsym(libHandles[uVar3],"abc_init");
      if (pcVar2 == (code *)0x0) {
        printf("Warning: Failed to initialize library %d.\n",uVar3 & 0xffffffff);
      }
      else {
        (*pcVar2)(pAbc);
      }
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
    } while (libHandles[lVar1] != (void *)0x0);
  }
  return;
}

Assistant:

void call_inits(Abc_Frame_t* pAbc) {
    int i;
    lib_init_end_func init_func;
    for (i = 0; libHandles[i] != 0; i++) {
        init_func = (lib_init_end_func) get_fnct_ptr(i, "abc_init");
        if (init_func == 0) {
            printf("Warning: Failed to initialize library %d.\n", i);
        } else {
            (*init_func)(pAbc);
        }
    }
}